

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineRecord2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::LineRecord2::Decode(LineRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  LineRecord2 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x50) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  LineRecord1::Decode(&this->super_LineRecord1,local_18);
  stream_00 = operator>>(local_18,&(this->m_StartVel).super_DataTypeBase);
  operator>>(stream_00,&(this->m_EndVel).super_DataTypeBase);
  return;
}

Assistant:

void LineRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LINE_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LineRecord1::Decode( stream );

    stream >> KDIS_STREAM m_StartVel
           >> KDIS_STREAM m_EndVel;
}